

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

void __thiscall
avro::NodeRecord::NodeRecord
          (NodeRecord *this,HasName *name,MultiLeaves *fields,LeafNames *fieldsNames,
          vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *dv)

{
  bool bVar1;
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  pointer pbVar2;
  ulong index;
  long lVar3;
  put_holder<char,_std::char_traits<char>_> local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(&this->super_NodeImplRecord,AVRO_RECORD,name,fields,fieldsNames,
             (NoAttribute<int> *)&local_108);
  (this->super_NodeImplRecord).super_Node._vptr_Node = (_func_int **)&PTR__NodeRecord_00191df8;
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::vector
            (&this->defaultValues,dv);
  pbVar2 = (this->super_NodeImplRecord).leafNameAttributes_.attrs_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_NodeImplRecord).leafNameAttributes_.attrs_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    lVar3 = 0;
    index = 0;
    do {
      bVar1 = concepts::
              NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::add(&(this->super_NodeImplRecord).nameIndex_,
                    (string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3),index);
      if (!bVar1) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (&local_108,"Cannot add duplicate name: %1%");
        pbVar2 = (this->super_NodeImplRecord).leafNameAttributes_.attrs_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (index < (ulong)((long)(this->super_NodeImplRecord).leafNameAttributes_.attrs_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
          local_120.arg = (void *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3);
          local_120.put_head =
               boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string>;
          local_120.put_last =
               boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string>;
          msg = boost::io::detail::
                feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                          (&local_108,&local_120);
          Exception::Exception(this_00,msg);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index
                  );
      }
      index = index + 1;
      pbVar2 = (this->super_NodeImplRecord).leafNameAttributes_.attrs_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (index < (ulong)((long)(this->super_NodeImplRecord).leafNameAttributes_.attrs_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5));
  }
  return;
}

Assistant:

NodeRecord(const HasName &name, const MultiLeaves &fields,
        const LeafNames &fieldsNames,
        const std::vector<GenericDatum>& dv) :
        NodeImplRecord(AVRO_RECORD, name, fields, fieldsNames, NoSize()),
        defaultValues(dv) { 
        for (size_t i = 0; i < leafNameAttributes_.size(); ++i) {
            if (!nameIndex_.add(leafNameAttributes_.get(i), i)) {
                throw Exception(boost::format(
                    "Cannot add duplicate name: %1%") %
                    leafNameAttributes_.get(i));
            }
        }
    }